

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Limiter.h
# Opt level: O3

Code __thiscall Limiter::ValidateRequest(Limiter *this)

{
  int iVar1;
  undefined8 uVar2;
  Code CVar3;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar1 == 0) {
    CVar3 = TooManyRequests;
    if ((this->hitQueue_).activeHitsSum_ < this->maxRPS_) {
      CVar3 = Ok;
      HitQueue::AddHit(&this->hitQueue_);
    }
    pthread_mutex_unlock((pthread_mutex_t *)this);
    return CVar3;
  }
  uVar2 = std::__throw_system_error(iVar1);
  pthread_mutex_unlock((pthread_mutex_t *)this);
  _Unwind_Resume(uVar2);
}

Assistant:

HttpResult::Code ValidateRequest()
    {
        std::lock_guard<std::mutex> l(mutex_);
        if (hitQueue_.ActiveSum() >= maxRPS_)
        {
            return HttpResult::Code::TooManyRequests;
        }
        hitQueue_.AddHit();
        return HttpResult::Code::Ok;
    }